

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void uECC_vli_rshift1(uECC_word_t *vli,wordcount_t num_words)

{
  ulong uVar1;
  uECC_word_t *puVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  
  uVar3 = 0;
  for (puVar2 = vli + (int)CONCAT71(in_register_00000031,num_words); vli < puVar2;
      puVar2 = puVar2 + -1) {
    uVar1 = puVar2[-1];
    puVar2[-1] = uVar1 >> 1 | uVar3;
    uVar3 = uVar1 << 0x3f;
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_rshift1(uECC_word_t *vli, wordcount_t num_words) {
    uECC_word_t *end = vli;
    uECC_word_t carry = 0;

    vli += num_words;
    while (vli-- > end) {
        uECC_word_t temp = *vli;
        *vli = (temp >> 1) | carry;
        carry = temp << (uECC_WORD_BITS - 1);
    }
}